

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O1

char * __thiscall
__cxxabiv1::anon_unknown_0::parse_dot_expr<__cxxabiv1::(anonymous_namespace)::Db>
          (anon_unknown_0 *this,char *first,char *last,Db *db)

{
  long lVar1;
  anon_unknown_0 *this_00;
  anon_unknown_0 *paVar2;
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  *this_01;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  name;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_68;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_48;
  
  if ((((2 < (long)first - (long)this) && (*this == (anon_unknown_0)0x64)) &&
      (this[1] == (anon_unknown_0)0x74)) &&
     (((this_00 = (anon_unknown_0 *)
                  parse_expression<__cxxabiv1::(anonymous_namespace)::Db>
                            ((char *)(this + 2),first,(Db *)last), this_00 != this + 2 &&
       (paVar2 = (anon_unknown_0 *)
                 parse_unresolved_name<__cxxabiv1::(anonymous_namespace)::Db>(this_00,first,last,db)
       , paVar2 != this_00)) && (0x40 < (ulong)(*(long *)(last + 0x10) - *(long *)(last + 8)))))) {
    this_01 = (string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
               *)(*(long *)(last + 0x10) + -0x40);
    string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
    ::move_full(&local_48,this_01);
    lVar1 = *(long *)(last + 0x10);
    *(short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>
      **)(last + 0x10) =
         (short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>
          *)(lVar1 + -0x40);
    std::
    allocator_traits<__cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>,4096ul>>
    ::
    destroy<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>>
              ((short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>
                *)(lVar1 + -0x40),this_01);
    std::operator+(&local_68,".",&local_48);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::_M_append((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                 *)(*(long *)(last + 0x10) + -0x40),local_68._M_dataplus._M_p,
                local_68._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      free(local_68._M_dataplus._M_p);
    }
    this = paVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      free(local_48._M_dataplus._M_p);
    }
  }
  return (char *)this;
}

Assistant:

const char*
parse_dot_expr(const char* first, const char* last, C& db)
{
    if (last - first >= 3 && first[0] == 'd' && first[1] == 't')
    {
        const char* t = parse_expression(first+2, last, db);
        if (t != first+2)
        {
            const char* t1 = parse_unresolved_name(t, last, db);
            if (t1 != t)
            {
                if (db.names.size() < 2)
                    return first;
                auto name = db.names.back().move_full();
                db.names.pop_back();
                db.names.back().first += "." + name;
                first = t1;
            }
        }
    }
    return first;
}